

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

void MirrorUVPlane(uint8_t *src_uv,int src_stride_uv,uint8_t *dst_uv,int dst_stride_uv,int width,
                  int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    src_uv = src_uv + ~height * src_stride_uv;
    src_stride_uv = -src_stride_uv;
  }
  iVar2 = libyuv::TestCpuFlag(0x40);
  if ((width & 7U) == 0) {
    pcVar4 = MirrorUVRow_SSSE3;
  }
  else {
    pcVar4 = MirrorUVRow_Any_SSSE3;
  }
  if (iVar2 == 0) {
    pcVar4 = MirrorUVRow_C;
  }
  iVar2 = libyuv::TestCpuFlag(0x400);
  if ((width & 0xfU) == 0) {
    pcVar3 = MirrorUVRow_AVX2;
  }
  else {
    pcVar3 = MirrorUVRow_Any_AVX2;
  }
  if (iVar2 == 0) {
    pcVar3 = pcVar4;
  }
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    (*pcVar3)(src_uv,dst_uv,width);
    src_uv = src_uv + src_stride_uv;
    dst_uv = dst_uv + dst_stride_uv;
  }
  return;
}

Assistant:

LIBYUV_API
void MirrorUVPlane(const uint8_t* src_uv,
                   int src_stride_uv,
                   uint8_t* dst_uv,
                   int dst_stride_uv,
                   int width,
                   int height) {
  int y;
  void (*MirrorUVRow)(const uint8_t* src, uint8_t* dst, int width) =
      MirrorUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uv = src_uv + (height - 1) * src_stride_uv;
    src_stride_uv = -src_stride_uv;
  }
#if defined(HAS_MIRRORUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MirrorUVRow = MirrorUVRow_Any_NEON;
    if (IS_ALIGNED(width, 32)) {
      MirrorUVRow = MirrorUVRow_NEON;
    }
  }
#endif
#if defined(HAS_MIRRORUVROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    MirrorUVRow = MirrorUVRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      MirrorUVRow = MirrorUVRow_SSSE3;
    }
  }
#endif
#if defined(HAS_MIRRORUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    MirrorUVRow = MirrorUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      MirrorUVRow = MirrorUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_MIRRORUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    MirrorUVRow = MirrorUVRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      MirrorUVRow = MirrorUVRow_MSA;
    }
  }
#endif

  // MirrorUV plane
  for (y = 0; y < height; ++y) {
    MirrorUVRow(src_uv, dst_uv, width);
    src_uv += src_stride_uv;
    dst_uv += dst_stride_uv;
  }
}